

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getNextNode<(TasGrid::TypeOneDRule)6>
                 (vector<double,_std::allocator<double>_> *nodes)

{
  OptimizerResult OVar1;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,nodes);
  OVar1 = computeMaximum<(TasGrid::TypeOneDRule)6>
                    ((CurrentNodes<(TasGrid::TypeOneDRule)6> *)&local_20);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return OVar1.node;
}

Assistant:

double getNextNode(std::vector<double> const &nodes){
    return computeMaximum(CurrentNodes<rule>(nodes)).node;
}